

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O1

void __thiscall adios2::format::BP5Serializer::BP5Serializer(BP5Serializer *this)

{
  BP5Base::BP5Base((BP5Base *)&this->field_0x150);
  this->_vptr_BP5Serializer = (_func_int **)&VTT;
  this->m_Engine = (Engine *)0x0;
  this->m_StatsLevel = 1;
  this->m_PreMetaMetadataFileLength = 0;
  this->m_BufferAlign = 1;
  this->m_BufferBlockSize = 0x20;
  (this->Info).LocalFMContext = (FMContext)0x0;
  (this->Info).MetaFieldCount = 0;
  (this->Info).MetaFields = (FMFieldList)0x0;
  (this->Info).AttributeFieldCount = 0;
  (this->Info).AttributeFields = (FMFieldList)0x0;
  (this->Info).AttributeFormat = (FMFormat)0x0;
  *(undefined8 *)((long)&(this->Info).AttributeFormat + 4) = 0;
  *(undefined8 *)((long)&(this->Info).AttributeData + 4) = 0;
  this->GenericAttributeFormat = (FMFormat)0x0;
  (this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NewStructFormats).super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DeferredExterns).
  super__Vector_base<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DeferredExterns).
  super__Vector_base<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DeferredExterns).
  super__Vector_base<adios2::format::BP5Serializer::DeferredExtern,_std::allocator<adios2::format::BP5Serializer::DeferredExtern>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DefSpanMinMax).
  super__Vector_base<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DefSpanMinMax).
  super__Vector_base<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DefSpanMinMax).
  super__Vector_base<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->DefSpanMinMax).
           super__Vector_base<adios2::format::BP5Serializer::DeferredSpanMinMax,_std::allocator<adios2::format::BP5Serializer::DeferredSpanMinMax>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&this->PendingAttrs + 4) = 0;
  (this->Info).RecNameMap._M_h._M_buckets = &(this->Info).RecNameMap._M_h._M_single_bucket;
  (this->Info).RecNameMap._M_h._M_bucket_count = 1;
  (this->Info).RecNameMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Info).RecNameMap._M_h._M_element_count = 0;
  (this->Info).RecNameMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(this->Info).RecNameMap._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)((long)&this->MetadataBuf + 1) = 0;
  (this->Info).RecNameMap._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Info).RecNameMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->PreviousMetaMetaInfoBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_PriorDataBufferSizeTotal = 0;
  (this->PreviousMetaMetaInfoBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreviousMetaMetaInfoBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->MetadataSize = 0;
  this->CurDataBuffer = (BufferV *)0x0;
  Init(this);
  return;
}

Assistant:

BP5Serializer::BP5Serializer() { Init(); }